

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.cpp
# Opt level: O3

ArrowErrorCode duckdb_nanoarrow::ArrowSchemaSetName(ArrowSchema *schema,char *name)

{
  size_t sVar1;
  char *__dest;
  
  if (schema->name != (char *)0x0) {
    free(schema->name);
  }
  if (name == (char *)0x0) {
    schema->name = (char *)0x0;
  }
  else {
    sVar1 = strlen(name);
    __dest = (char *)malloc(sVar1 + 1);
    schema->name = __dest;
    if (__dest == (char *)0x0) {
      return 0xc;
    }
    switchD_012bc561::default(__dest,name,sVar1 + 1);
  }
  return 0;
}

Assistant:

ArrowErrorCode ArrowSchemaSetName(struct ArrowSchema *schema, const char *name) {
	if (schema->name != NULL) {
		ArrowFree((void *)schema->name);
	}

	if (name != NULL) {
		size_t name_size = strlen(name) + 1;
		schema->name = (const char *)ArrowMalloc(int64_t(name_size));
		if (schema->name == NULL) {
			return ENOMEM;
		}

		memcpy((void *)schema->name, name, name_size);
	} else {
		schema->name = NULL;
	}

	return NANOARROW_OK;
}